

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::
ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>>
::construct<unsigned_int_const&,double_const&,double_const&>
          (ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>_>
           *this,uint *args,double *args_1,double *args_2)

{
  long lVar1;
  pointer pNVar2;
  Node *__p;
  allocator_type *in_RCX;
  allocator_type *in_RDI;
  Node *object;
  double *in_stack_ffffffffffffffc8;
  Node **in_stack_ffffffffffffffd8;
  
  if (*(ulong *)(in_RDI + 0x10) <= *(ulong *)(in_RDI + 8)) {
    pNVar2 = std::allocator_traits<std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>_>::
             allocate(in_RDI,(size_type)in_stack_ffffffffffffffc8);
    *(pointer *)in_RDI = pNVar2;
    std::
    vector<mapbox::detail::Earcut<unsigned_int>::Node*,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node*>>
    ::emplace_back<mapbox::detail::Earcut<unsigned_int>::Node*&>
              ((vector<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>
                *)in_RCX,in_stack_ffffffffffffffd8);
    *(undefined8 *)(in_RDI + 8) = 0;
  }
  lVar1 = *(long *)(in_RDI + 8);
  *(long *)(in_RDI + 8) = lVar1 + 1;
  __p = (Node *)(*(long *)in_RDI + lVar1 * 0x48);
  std::allocator_traits<std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>>::
  construct<mapbox::detail::Earcut<unsigned_int>::Node,unsigned_int_const&,double_const&,double_const&>
            (in_RCX,__p,(uint *)in_RDI,in_stack_ffffffffffffffc8,(double *)0x19d1c2);
  return __p;
}

Assistant:

T* construct(Args&&... args) {
            if (currentIndex >= blockSize) {
                currentBlock = alloc_traits::allocate(alloc, blockSize);
                allocations.emplace_back(currentBlock);
                currentIndex = 0;
            }
            T* object = &currentBlock[currentIndex++];
            alloc_traits::construct(alloc, object, std::forward<Args>(args)...);
            return object;
        }